

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu540c.c
# Opt level: O2

MPP_RET hal_h265e_v540c_wait(void *hal,HalEncTask *task)

{
  MPP_RET MVar1;
  
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) enter\n",(char *)0x0,0x627);
  }
  if ((task->flags).err == 0) {
    MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
    if (MVar1 != MPP_OK) {
      _mpp_log_l(2,"hal_h265e_v540c","poll cmd failed %d status %d \n","hal_h265e_v540c_wait",
                 (ulong)(uint)MVar1,(ulong)*(uint *)((long)hal + 0x78));
    }
    if (((byte)hal_h265e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h265e_v540c","(%d) leave\n",(char *)0x0,0x66d);
    }
  }
  else {
    _mpp_log_l(2,"hal_h265e_v540c","enc_task->flags.err %08x, return early","hal_h265e_v540c_wait");
    MVar1 = MPP_NOK;
  }
  return MVar1;
}

Assistant:

MPP_RET hal_h265e_v540c_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    H265eV540cHalContext *ctx = (H265eV540cHalContext *)hal;
    HalEncTask *enc_task = task;
    H265eV540cStatusElem *elem = (H265eV540cStatusElem *)ctx->reg_out;
    hal_h265e_enter();

    if (enc_task->flags.err) {
        hal_h265e_err("enc_task->flags.err %08x, return early",
                      enc_task->flags.err);
        return MPP_NOK;
    }

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);

#ifdef DUMP_DATA
    static FILE *fp_fbd = NULL;
    static FILE *fp_fbh = NULL;
    static FILE *fp_dws = NULL;
    HalBuf *recon_buf;
    static RK_U32 frm_num = 0;
    H265eSyntax_new *syn = (H265eSyntax_new *)enc_task->syntax.data;
    recon_buf = hal_bufs_get_buf(ctx->dpb_bufs, syn->sp.recon_pic.slot_idx);
    char file_name[20] = "";
    size_t rec_size = mpp_buffer_get_size(recon_buf->buf[0]);
    size_t dws_size = mpp_buffer_get_size(recon_buf->buf[1]);

    void *ptr = mpp_buffer_get_ptr(recon_buf->buf[0]);
    void *dws_ptr = mpp_buffer_get_ptr(recon_buf->buf[1]);

    sprintf(&file_name[0], "fbd%d.bin", frm_num);
    if (fp_fbd != NULL) {
        fclose(fp_fbd);
        fp_fbd = NULL;
    } else {
        fp_fbd = fopen(file_name, "wb+");
    }
    if (fp_fbd) {
        fwrite(ptr + ctx->fbc_header_len, 1, rec_size - ctx->fbc_header_len, fp_fbd);
        fflush(fp_fbd);
    }

    sprintf(&file_name[0], "fbh%d.bin", frm_num);

    if (fp_fbh != NULL) {
        fclose(fp_fbh);
        fp_fbh = NULL;
    } else {
        fp_fbh = fopen(file_name, "wb+");
    }

    if (fp_fbh) {
        fwrite(ptr , 1, ctx->fbc_header_len, fp_fbh);
        fflush(fp_fbh);
    }


    sprintf(&file_name[0], "dws%d.bin", frm_num);

    if (fp_dws != NULL) {
        fclose(fp_dws);
        fp_dws = NULL;
    } else {
        fp_dws = fopen(file_name, "wb+");
    }

    if (fp_dws) {
        fwrite(dws_ptr , 1, dws_size, fp_dws);
        fflush(fp_dws);
    }
    frm_num++;
#endif
    if (ret)
        mpp_err_f("poll cmd failed %d status %d \n", ret, elem->hw_status);

    hal_h265e_leave();
    return ret;
}